

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O0

void ReadDUH(DUH *duh,input_mod *info,bool meta,bool dos)

{
  DUMB_IT_SIGDATA *pDVar1;
  char *pcVar2;
  DUMB_IT_SIGDATA *itsd;
  bool dos_local;
  bool meta_local;
  input_mod *info_local;
  DUH *duh_local;
  
  if ((duh != (DUH *)0x0) &&
     (pDVar1 = duh_get_it_sigdata((DUH *)0x42a164), pDVar1 != (DUMB_IT_SIGDATA *)0x0)) {
    info->NumChannels = pDVar1->n_pchannels;
    info->NumPatterns = pDVar1->n_patterns;
    info->NumOrders = pDVar1->n_orders;
    pcVar2 = duh_get_tag((DUH *)info,(char *)CONCAT17(meta,CONCAT16(dos,itsd._0_6_)));
    FString::operator=(&info->Codec,pcVar2);
    pcVar2 = duh_get_tag((DUH *)info,(char *)CONCAT17(meta,CONCAT16(dos,itsd._0_6_)));
    FString::operator=(&info->TrackerVersion,pcVar2);
    pcVar2 = duh_get_tag((DUH *)info,(char *)CONCAT17(meta,CONCAT16(dos,itsd._0_6_)));
    FString::operator=(&info->FormatVersion,pcVar2);
  }
  return;
}

Assistant:

static void ReadDUH(DUH * duh, input_mod *info, bool meta, bool dos)
{
	if (!duh) return;

	DUMB_IT_SIGDATA * itsd = duh_get_it_sigdata(duh);

	if (!itsd) return;

	info->NumChannels = itsd->n_pchannels;
	info->NumPatterns = itsd->n_patterns;
	info->NumOrders = itsd->n_orders;

	if (meta)
	{
		if (itsd->name[0])
		{
			//if (dos) info.meta_add(field_title, string_utf8_from_oem((char*)&itsd->name, sizeof(itsd->name)));
			//else info.meta_add(field_title, pfc::stringcvt::string_utf8_from_ansi((char *)&itsd->name, sizeof(itsd->name)));
		}
		if (itsd->song_message && *itsd->song_message)
		{
			//if (dos) info.meta_add(field_comment, string_utf8_from_oem_multiline((char*)itsd->song_message));
			//else info.meta_add(field_comment, pfc::stringcvt::string_utf8_from_ansi((char *)itsd->song_message));
		}
	}

	info->Codec = duh_get_tag(duh, "FORMAT");
	info->TrackerVersion = duh_get_tag(duh, "TRACKERVERSION");
	info->FormatVersion = duh_get_tag(duh, "FORMATVERSION");

#if 0
	FString name;

	if (itsd->n_samples)
	{
		int i, n;
		//info.info_set_int(field_samples, itsd->n_samples);

		if (meta && itsd->sample)
		{
			for (i = 0, n = itsd->n_samples; i < n; i++)
			{
				if (itsd->sample[i].name[0])
				{
					name = "smpl";
					if (i < 10) name += '0';
					name += '0' + i;
					//if (dos) info.meta_add(name, string_utf8_from_oem((char*)&itsd->sample[i].name, sizeof(itsd->sample[i].name)));
					//else info.meta_add(name, pfc::stringcvt::string_utf8_from_ansi((char *)&itsd->sample[i].name, sizeof(itsd->sample[i].name)));
				}
			}
		}
	}

	if (itsd->n_instruments)
	{
		//info.info_set_int(field_instruments, itsd->n_instruments);

		if (meta && itsd->instrument)
		{
			for (i = 0, n = itsd->n_instruments; i < n; i++)
			{
				if (itsd->instrument[i].name[0])
				{
					name = "inst";
					if (i < 10) name += '0';
					name += '0' + i;
					//if (dos) info.meta_add(name, string_utf8_from_oem((char*)&itsd->instrument[i].name, sizeof(itsd->instrument[i].name)));
					//else info.meta_add(name, pfc::stringcvt::string_utf8_from_ansi((char *)&itsd->instrument[i].name, sizeof(itsd->instrument[i].name)));
				}
			}
		}
	}
#endif
}